

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanohttp.c
# Opt level: O0

int xmlNanoHTTPRead(void *ctx,void *dest,int len)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int z_ret;
  int orig_avail_in;
  int bytes_read;
  xmlNanoHTTPCtxtPtr ctxt;
  int len_local;
  void *dest_local;
  void *ctx_local;
  
  z_ret = 0;
  if (ctx == (void *)0x0) {
    ctx_local._4_4_ = -1;
  }
  else if (dest == (void *)0x0) {
    ctx_local._4_4_ = -1;
  }
  else if (len < 1) {
    ctx_local._4_4_ = 0;
  }
  else if (*(int *)((long)ctx + 0xa8) == 1) {
    if (*(long *)((long)ctx + 0xa0) == 0) {
      ctx_local._4_4_ = 0;
    }
    else {
      *(void **)(*(long *)((long)ctx + 0xa0) + 0x18) = dest;
      *(int *)(*(long *)((long)ctx + 0xa0) + 0x20) = len;
      *(int *)(*(long *)((long)ctx + 0xa0) + 8) =
           (int)*(undefined8 *)((long)ctx + 0x50) - (int)*(undefined8 *)((long)ctx + 0x58);
      do {
        bVar1 = false;
        if ((*(int *)(*(long *)((long)ctx + 0xa0) + 0x20) != 0) &&
           (bVar1 = true, *(int *)(*(long *)((long)ctx + 0xa0) + 8) == 0)) {
          iVar2 = xmlNanoHTTPRecv((xmlNanoHTTPCtxtPtr)ctx);
          bVar1 = 0 < iVar2;
        }
        if (!bVar1) break;
        iVar2 = ((int)*(undefined8 *)((long)ctx + 0x50) - (int)*(undefined8 *)((long)ctx + 0x58)) -
                z_ret;
        *(int *)(*(long *)((long)ctx + 0xa0) + 8) = iVar2;
        **(long **)((long)ctx + 0xa0) = *(long *)((long)ctx + 0x58) + (long)z_ret;
        iVar3 = inflate(*(undefined8 *)((long)ctx + 0xa0),0);
        z_ret = (iVar2 - *(int *)(*(long *)((long)ctx + 0xa0) + 8)) + z_ret;
      } while (iVar3 == 0);
      *(long *)((long)ctx + 0x58) = *(long *)((long)ctx + 0x58) + (long)z_ret;
      ctx_local._4_4_ = len - *(int *)(*(long *)((long)ctx + 0xa0) + 0x20);
    }
  }
  else {
    do {
      if ((long)len <= *(long *)((long)ctx + 0x50) - *(long *)((long)ctx + 0x58)) break;
      iVar2 = xmlNanoHTTPRecv((xmlNanoHTTPCtxtPtr)ctx);
    } while (0 < iVar2);
    ctxt._4_4_ = len;
    if (*(long *)((long)ctx + 0x50) - *(long *)((long)ctx + 0x58) < (long)len) {
      ctxt._4_4_ = (int)*(undefined8 *)((long)ctx + 0x50) - (int)*(undefined8 *)((long)ctx + 0x58);
    }
    memcpy(dest,*(void **)((long)ctx + 0x58),(long)ctxt._4_4_);
    *(long *)((long)ctx + 0x58) = *(long *)((long)ctx + 0x58) + (long)ctxt._4_4_;
    ctx_local._4_4_ = ctxt._4_4_;
  }
  return ctx_local._4_4_;
}

Assistant:

int
xmlNanoHTTPRead(void *ctx, void *dest, int len) {
    xmlNanoHTTPCtxtPtr ctxt = (xmlNanoHTTPCtxtPtr) ctx;
#ifdef LIBXML_ZLIB_ENABLED
    int bytes_read = 0;
    int orig_avail_in;
    int z_ret;
#endif

    if (ctx == NULL) return(-1);
    if (dest == NULL) return(-1);
    if (len <= 0) return(0);

#ifdef LIBXML_ZLIB_ENABLED
    if (ctxt->usesGzip == 1) {
        if (ctxt->strm == NULL) return(0);

        ctxt->strm->next_out = dest;
        ctxt->strm->avail_out = len;
	ctxt->strm->avail_in = ctxt->inptr - ctxt->inrptr;

        while (ctxt->strm->avail_out > 0 &&
	       (ctxt->strm->avail_in > 0 || xmlNanoHTTPRecv(ctxt) > 0)) {
            orig_avail_in = ctxt->strm->avail_in =
			    ctxt->inptr - ctxt->inrptr - bytes_read;
            ctxt->strm->next_in = BAD_CAST (ctxt->inrptr + bytes_read);

            z_ret = inflate(ctxt->strm, Z_NO_FLUSH);
            bytes_read += orig_avail_in - ctxt->strm->avail_in;

            if (z_ret != Z_OK) break;
	}

        ctxt->inrptr += bytes_read;
        return(len - ctxt->strm->avail_out);
    }
#endif

    while (ctxt->inptr - ctxt->inrptr < len) {
        if (xmlNanoHTTPRecv(ctxt) <= 0) break;
    }
    if (ctxt->inptr - ctxt->inrptr < len)
        len = ctxt->inptr - ctxt->inrptr;
    memcpy(dest, ctxt->inrptr, len);
    ctxt->inrptr += len;
    return(len);
}